

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Flow(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *p;
  Vec_Int_t *pVVar1;
  int iVar2;
  uint uVar3;
  uint fUseMfs;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  uint fVerbose;
  uint fMinAve;
  uint local_48;
  uint local_44;
  
  fMinAve = 0;
  Extra_UtilGetoptReset();
  local_44 = 8;
  local_48 = 6;
  fUseMfs = 0;
  fVerbose = 0;
LAB_002504f4:
  do {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"KCtmvh"), iVar4 = globalUtilOptind, iVar2 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar2 == -1) {
      p = pAbc->pGia;
      if (p != (Gia_Man_t *)0x0) {
        pVVar1 = p->vMapping;
        iVar4 = Gia_ManAndNum(p);
        iVar2 = Gia_ManLevelNum(p);
        Gia_ManPerformFlow((uint)(pVVar1 != (Vec_Int_t *)0x0),iVar4,iVar2,local_48,local_44,fMinAve,
                           fUseMfs,fVerbose);
        return 0;
      }
      pcVar5 = "Abc_CommandAbc9Flow(): There is no AIG.\n";
      iVar4 = -1;
      goto LAB_002506e9;
    }
    if (iVar2 == 0x43) {
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_00250626:
        Abc_Print(-1,pcVar5);
        goto LAB_00250630;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_44 = uVar3;
    }
    else {
      if (iVar2 == 0x74) {
        fMinAve = fMinAve ^ 1;
        goto LAB_002504f4;
      }
      if (iVar2 == 0x6d) {
        fUseMfs = fUseMfs ^ 1;
        goto LAB_002504f4;
      }
      if (iVar2 != 0x4b) goto LAB_00250630;
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-K\" should be followed by an integer.\n";
        goto LAB_00250626;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_48 = uVar3;
    }
    globalUtilOptind = iVar4 + 1;
    if ((int)uVar3 < 0) {
LAB_00250630:
      iVar4 = -2;
      Abc_Print(-2,"usage: &flow [-KC num] [-tmvh]\n");
      Abc_Print(-2,"\t         integration optimization and mapping flow\n");
      Abc_Print(-2,"\t-K num : the number of LUT inputs (LUT size) [default = %d]\n",(ulong)local_48
               );
      Abc_Print(-2,"\t-C num : the number of cuts at a node [default = %d]\n",(ulong)local_44);
      pcVar6 = "yes";
      pcVar5 = "yes";
      if (fMinAve == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-t     : toggle minimizing average rather than max delay [default = %s]\n",
                pcVar5);
      pcVar5 = "yes";
      if (fUseMfs == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-m     : toggle using \"mfs2\" in the script [default = %s]\n",pcVar5);
      if (fVerbose == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar6);
      pcVar5 = "\t-h     : print the command usage\n";
LAB_002506e9:
      Abc_Print(iVar4,pcVar5);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Flow( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_ManPerformFlow( int fIsMapped, int nAnds, int nLevels, int nLutSize, int nCutNum, int fMinAve, int fUseMfs, int fVerbose );
    int nLutSize    =  6;
    int nCutNum     =  8;
    int fMinAve     =  0;
    int fUseMfs     =  0;
    int c, fVerbose =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "KCtmvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLutSize < 0 )
                goto usage;
            break;
         case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nCutNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCutNum < 0 )
                goto usage;
            break;
        case 't':
            fMinAve ^= 1;
            break;
        case 'm':
            fUseMfs ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Flow(): There is no AIG.\n" );
        return 1;
    }
    Gia_ManPerformFlow( Gia_ManHasMapping(pAbc->pGia), Gia_ManAndNum(pAbc->pGia), Gia_ManLevelNum(pAbc->pGia), nLutSize, nCutNum, fMinAve, fUseMfs, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: &flow [-KC num] [-tmvh]\n" );
    Abc_Print( -2, "\t         integration optimization and mapping flow\n" );
    Abc_Print( -2, "\t-K num : the number of LUT inputs (LUT size) [default = %d]\n", nLutSize );
    Abc_Print( -2, "\t-C num : the number of cuts at a node [default = %d]\n", nCutNum );
    Abc_Print( -2, "\t-t     : toggle minimizing average rather than max delay [default = %s]\n", fMinAve? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle using \"mfs2\" in the script [default = %s]\n", fUseMfs? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}